

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O2

void __thiscall
ddd::DaTrie<false,_false,_false>::edge_
          (DaTrie<false,_false,_false> *this,uint32_t node_pos,Edge *edge,size_t upper)

{
  pointer pBVar1;
  uint uVar2;
  size_t sVar3;
  uint32_t label;
  uint uVar4;
  
  pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (-1 < (long)pBVar1[node_pos]) {
    __assert_fail("bc_[node_pos].is_fixed()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x3d5,
                  "void ddd::DaTrie<false, false, false>::edge_(uint32_t, Edge &, size_t) const [WithBLM = false, WithNLM = false, Prefix = false]"
                 );
  }
  edge->size_ = 0;
  uVar2 = SUB84(pBVar1[node_pos],0);
  if ((-1 < (int)uVar2) && (uVar2 != 0x7fffffff)) {
    sVar3 = 0;
    for (uVar4 = 0; uVar4 != 0x100; uVar4 = uVar4 + 1) {
      if ((*(uint *)&(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar4 ^ uVar2].field_0x4 & 0x7fffffff) ==
          node_pos) {
        edge->size_ = sVar3 + 1;
        edge->labels_[sVar3] = (uint8_t)uVar4;
        sVar3 = edge->size_;
        if (sVar3 == upper) {
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void edge_(uint32_t node_pos, Edge& edge, size_t upper = 256) const {
    assert(bc_[node_pos].is_fixed());

    edge.clear();
    if (bc_[node_pos].is_leaf()) {
      return;
    }

    auto base = bc_[node_pos].base();
    if (base == INVALID_VALUE) { // for prefix subtrie
      return;
    }

    if (WithNLM) {
      edge.push(node_links_[node_pos].child);
      auto child_pos = base ^node_links_[node_pos].child;
      assert(bc_[child_pos].check() == node_pos);
      while (edge.size() < upper && node_links_[child_pos].sib != node_links_[node_pos].child) {
        edge.push(node_links_[child_pos].sib);
        child_pos = base ^ node_links_[child_pos].sib;
        assert(bc_[child_pos].check() == node_pos);
      }
    } else {
      for (uint32_t label = 0; label < 256; ++label) {
        auto child_pos = base ^label;
        if (bc_[child_pos].check() == node_pos) {
          edge.push(static_cast<uint8_t>(label));
          if (edge.size() == upper) {
            break;
          }
        }
      }
    }
  }